

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_gej *prej,secp256k1_fe *zr,secp256k1_gej *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint64_t uVar68;
  uint64_t uVar69;
  uint64_t uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  long lVar75;
  secp256k1_gej *a_00;
  undefined4 in_register_0000003c;
  secp256k1_gej *psVar76;
  ulong uVar77;
  ulong uVar78;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_gej d;
  secp256k1_ge d_ge;
  secp256k1_ge a_ge;
  secp256k1_gej local_168;
  secp256k1_ge local_e8;
  secp256k1_ge local_88;
  
  psVar76 = (secp256k1_gej *)CONCAT44(in_register_0000003c,n);
  if ((int)zr[3].n[0] == 0) {
    secp256k1_gej_double(&local_168,(secp256k1_gej *)zr);
  }
  else {
    local_168.infinity = 1;
  }
  local_e8.x.n[4] = local_168.x.n[4];
  local_e8.x.n[2] = local_168.x.n[2];
  local_e8.x.n[3] = local_168.x.n[3];
  local_e8.x.n[0] = local_168.x.n[0];
  local_e8.x.n[1] = local_168.x.n[1];
  local_e8.y.n[0] = local_168.y.n[0];
  local_e8.y.n[1] = local_168.y.n[1];
  local_e8.y.n[2] = local_168.y.n[2];
  local_e8.y.n[3] = local_168.y.n[3];
  local_e8.y.n[4] = local_168.y.n[4];
  local_e8.infinity = 0;
  secp256k1_ge_set_gej_zinv(&local_88,(secp256k1_gej *)zr,&local_168.z);
  (psVar76->x).n[4] = local_88.x.n[4];
  (psVar76->x).n[2] = local_88.x.n[2];
  (psVar76->x).n[3] = local_88.x.n[3];
  (psVar76->x).n[0] = local_88.x.n[0];
  (psVar76->x).n[1] = local_88.x.n[1];
  (psVar76->y).n[0] = local_88.y.n[0];
  (psVar76->y).n[1] = local_88.y.n[1];
  (psVar76->y).n[2] = local_88.y.n[2];
  (psVar76->y).n[3] = local_88.y.n[3];
  (psVar76->y).n[4] = local_88.y.n[4];
  uVar68 = zr[2].n[0];
  uVar69 = zr[2].n[1];
  uVar70 = zr[2].n[3];
  (psVar76->z).n[2] = zr[2].n[2];
  (psVar76->z).n[3] = uVar70;
  (psVar76->z).n[0] = uVar68;
  (psVar76->z).n[1] = uVar69;
  (psVar76->z).n[4] = zr[2].n[4];
  psVar76->infinity = 0;
  (prej->x).n[4] = local_168.z.n[4];
  (prej->x).n[2] = local_168.z.n[2];
  (prej->x).n[3] = local_168.z.n[3];
  (prej->x).n[0] = local_168.z.n[0];
  (prej->x).n[1] = local_168.z.n[1];
  lVar75 = 0x28;
  a_00 = psVar76;
  do {
    secp256k1_gej_add_ge_var(a_00 + 1,a_00,&local_e8,(secp256k1_fe *)((long)(prej->x).n + lVar75));
    lVar75 = lVar75 + 0x28;
    a_00 = a_00 + 1;
  } while (lVar75 != 0x140);
  uVar74 = psVar76[7].z.n[0];
  uVar78 = psVar76[7].z.n[1];
  uVar1 = psVar76[7].z.n[2];
  uVar2 = psVar76[7].z.n[3];
  uVar3 = psVar76[7].z.n[4];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_168.z.n[0];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_168.z.n[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_168.z.n[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar78;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_168.z.n[3];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar74;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_168.z.n[4];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar3;
  uVar71 = SUB168(auVar8 * auVar38,0);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar71 & 0xfffffffffffff;
  auVar4 = auVar5 * auVar35 + auVar4 * auVar34 + auVar6 * auVar36 + auVar7 * auVar37 +
           auVar9 * ZEXT816(0x1000003d10);
  uVar72 = auVar4._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar72 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_168.z.n[0];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_168.z.n[1];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_168.z.n[2];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_168.z.n[3];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar78;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_168.z.n[4];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar74;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar71 >> 0x34 | SUB168(auVar8 * auVar38,8) << 0xc;
  auVar4 = auVar10 * auVar39 + auVar60 + auVar11 * auVar40 + auVar12 * auVar41 + auVar13 * auVar42 +
           auVar14 * auVar43 + auVar15 * ZEXT816(0x1000003d10);
  uVar71 = auVar4._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar71 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_168.z.n[0];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar74;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_168.z.n[1];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar3;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_168.z.n[2];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_168.z.n[3];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_168.z.n[4];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar78;
  auVar4 = auVar17 * auVar45 + auVar62 + auVar18 * auVar46 + auVar19 * auVar47 + auVar20 * auVar48;
  uVar73 = auVar4._0_8_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar73 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = (uVar73 & 0xfffffffffffff) << 4 | (uVar71 & 0xfffffffffffff) >> 0x30;
  uVar73 = auVar61._0_8_;
  auVar61 = auVar16 * auVar44 + ZEXT816(0x1000003d1) * auVar49;
  psVar76[7].z.n[0] = uVar73 & 0xfffffffffffff;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar73 >> 0x34 | auVar61._8_8_ << 0xc;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_168.z.n[0];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar78;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_168.z.n[1];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar74;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_168.z.n[2];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar3;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_168.z.n[3];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_168.z.n[4];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar1;
  auVar5 = auVar23 * auVar52 + auVar64 + auVar24 * auVar53 + auVar25 * auVar54;
  uVar73 = auVar5._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar73 & 0xfffffffffffff;
  auVar4 = auVar21 * auVar50 + auVar63 + auVar22 * auVar51 + auVar26 * ZEXT816(0x1000003d10);
  uVar77 = auVar4._0_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar73 >> 0x34 | auVar5._8_8_ << 0xc;
  psVar76[7].z.n[1] = uVar77 & 0xfffffffffffff;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar77 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_168.z.n[0];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar1;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_168.z.n[1];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar78;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_168.z.n[2];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar74;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_168.z.n[3];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar3;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_168.z.n[4];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar2;
  auVar5 = auVar30 * auVar58 + auVar66 + auVar31 * auVar59;
  uVar74 = auVar5._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar74 & 0xfffffffffffff;
  auVar4 = auVar27 * auVar55 + auVar65 + auVar28 * auVar56 + auVar29 * auVar57 +
           auVar32 * ZEXT816(0x1000003d10);
  uVar78 = auVar4._0_8_;
  psVar76[7].z.n[2] = uVar78 & 0xfffffffffffff;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = (uVar78 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar72 & 0xfffffffffffff);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar74 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar67 = auVar33 * ZEXT816(0x1000003d10) + auVar67;
  uVar74 = auVar67._0_8_;
  psVar76[7].z.n[3] = uVar74 & 0xfffffffffffff;
  psVar76[7].z.n[4] = (uVar74 >> 0x34 | auVar67._8_8_ << 0xc) + (uVar71 & 0xffffffffffff);
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_gej *prej, secp256k1_fe *zr, const secp256k1_gej *a) {
    secp256k1_gej d;
    secp256k1_ge a_ge, d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions on an isomorphism where 'd' is affine: drop the z coordinate
     * of 'd', and scale the 1P starting value's x/y coordinates without changing its z.
     */
    d_ge.x = d.x;
    d_ge.y = d.y;
    d_ge.infinity = 0;

    secp256k1_ge_set_gej_zinv(&a_ge, a, &d.z);
    prej[0].x = a_ge.x;
    prej[0].y = a_ge.y;
    prej[0].z = a->z;
    prej[0].infinity = 0;

    zr[0] = d.z;
    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&prej[i], &prej[i-1], &d_ge, &zr[i]);
    }

    /*
     * Each point in 'prej' has a z coordinate too small by a factor of 'd.z'. Only
     * the final point's z coordinate is actually used though, so just update that.
     */
    secp256k1_fe_mul(&prej[n-1].z, &prej[n-1].z, &d.z);
}